

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableType.cpp
# Opt level: O0

VariableType * rsg::VariableType::getScalarType(Type baseType)

{
  int iVar1;
  Exception *this;
  allocator<char> local_61;
  string local_60;
  VariableType *local_40;
  VariableType *local_38;
  VariableType *local_20;
  Type local_14;
  VariableType *pVStack_10;
  Type baseType_local;
  
  local_14 = baseType;
  switch(baseType) {
  case TYPE_FLOAT:
    if ((getScalarType(rsg::VariableType::Type)::s_floatTypes == '\0') &&
       (iVar1 = __cxa_guard_acquire(&getScalarType(rsg::VariableType::Type)::s_floatTypes),
       iVar1 != 0)) {
      local_20 = getScalarType::s_floatTypes;
      VariableType(getScalarType::s_floatTypes,TYPE_FLOAT,1);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&getScalarType(rsg::VariableType::Type)::s_floatTypes);
    }
    pVStack_10 = getScalarType::s_floatTypes;
    break;
  case TYPE_INT:
    if ((getScalarType(rsg::VariableType::Type)::s_intTypes == '\0') &&
       (iVar1 = __cxa_guard_acquire(&getScalarType(rsg::VariableType::Type)::s_intTypes), iVar1 != 0
       )) {
      local_38 = getScalarType::s_intTypes;
      VariableType(getScalarType::s_intTypes,TYPE_INT,1);
      __cxa_atexit(__cxx_global_array_dtor_1,0,&__dso_handle);
      __cxa_guard_release(&getScalarType(rsg::VariableType::Type)::s_intTypes);
    }
    pVStack_10 = getScalarType::s_intTypes;
    break;
  case TYPE_BOOL:
    if ((getScalarType(rsg::VariableType::Type)::s_boolTypes == '\0') &&
       (iVar1 = __cxa_guard_acquire(&getScalarType(rsg::VariableType::Type)::s_boolTypes),
       iVar1 != 0)) {
      local_40 = getScalarType::s_boolTypes;
      VariableType(getScalarType::s_boolTypes,TYPE_BOOL,1);
      __cxa_atexit(__cxx_global_array_dtor_2,0,&__dso_handle);
      __cxa_guard_release(&getScalarType(rsg::VariableType::Type)::s_boolTypes);
    }
    pVStack_10 = getScalarType::s_boolTypes;
    break;
  default:
    this = (Exception *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"VariableType::getScalarType(): unsupported type",&local_61);
    Exception::Exception(this,&local_60);
    __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
  case TYPE_SAMPLER_2D:
    if ((getScalarType(rsg::VariableType::Type)::sampler2DType == '\0') &&
       (iVar1 = __cxa_guard_acquire(&getScalarType(rsg::VariableType::Type)::sampler2DType),
       iVar1 != 0)) {
      VariableType(&getScalarType::sampler2DType,TYPE_SAMPLER_2D,1);
      __cxa_atexit(~VariableType,&getScalarType::sampler2DType,&__dso_handle);
      __cxa_guard_release(&getScalarType(rsg::VariableType::Type)::sampler2DType);
    }
    pVStack_10 = &getScalarType::sampler2DType;
    break;
  case TYPE_SAMPLER_CUBE:
    if ((getScalarType(rsg::VariableType::Type)::samplerCubeType == '\0') &&
       (iVar1 = __cxa_guard_acquire(&getScalarType(rsg::VariableType::Type)::samplerCubeType),
       iVar1 != 0)) {
      VariableType(&getScalarType::samplerCubeType,TYPE_SAMPLER_CUBE,1);
      __cxa_atexit(~VariableType,&getScalarType::samplerCubeType,&__dso_handle);
      __cxa_guard_release(&getScalarType(rsg::VariableType::Type)::samplerCubeType);
    }
    pVStack_10 = &getScalarType::samplerCubeType;
  }
  return pVStack_10;
}

Assistant:

const VariableType& VariableType::getScalarType (Type baseType)
{
	switch (baseType)
	{
		case TYPE_FLOAT:
		{
			static const VariableType s_floatTypes[] =
			{
				VariableType(TYPE_FLOAT, 1)
				// \todo [pyry] Extend with different precision variants?
			};
			return s_floatTypes[0];
		}

		case TYPE_INT:
		{
			static const VariableType s_intTypes[] =
			{
				VariableType(TYPE_INT, 1)
			};
			return s_intTypes[0];
		}

		case TYPE_BOOL:
		{
			static const VariableType s_boolTypes[] =
			{
				VariableType(TYPE_BOOL, 1)
			};
			return s_boolTypes[0];
		}

		case TYPE_SAMPLER_2D:
		{
			static const VariableType sampler2DType = VariableType(TYPE_SAMPLER_2D, 1);
			return sampler2DType;
		}

		case TYPE_SAMPLER_CUBE:
		{
			static const VariableType samplerCubeType = VariableType(TYPE_SAMPLER_CUBE, 1);
			return samplerCubeType;
		}

		default:
			DE_ASSERT(DE_FALSE);
			throw Exception("VariableType::getScalarType(): unsupported type");
	}
}